

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ord_hash_set.h
# Opt level: O1

void __thiscall re2c::ord_hash_set_t::~ord_hash_set_t(ord_hash_set_t *this)

{
  pointer ppeVar1;
  pointer ppeVar2;
  
  ppeVar1 = (this->elems).
            super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppeVar2 = (this->elems).
                 super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppeVar2 != ppeVar1;
      ppeVar2 = ppeVar2 + 1) {
    free(*ppeVar2);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>,_std::_Select1st<std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>_>_>
  ::~_Rb_tree(&(this->lookup)._M_t);
  ppeVar2 = (this->elems).
            super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppeVar2 != (pointer)0x0) {
    operator_delete(ppeVar2,(long)(this->elems).
                                  super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppeVar2
                   );
    return;
  }
  return;
}

Assistant:

ord_hash_set_t::~ord_hash_set_t()
{
	std::for_each(elems.begin(), elems.end(), free);
}